

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void check_lcp_and_cache<unsigned_int>
               (uchar *latest,uchar *from0,lcp_t lcp0,uint cache0,uchar *from1,lcp_t lcp1,
               uint cache1)

{
  bool bVar1;
  lcp_t unaff_RBX;
  lcp_t lVar2;
  lcp_t lVar3;
  uint uVar4;
  long lVar5;
  size_t i;
  lcp_t lVar6;
  
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar2 = lVar6;
    if ((latest[lVar5] == '\0') || (latest[lVar5] != from0[lVar5])) {
      bVar1 = false;
      lVar6 = lVar2;
    }
    else {
      lVar6 = lVar2 + 1;
      bVar1 = true;
      lVar2 = unaff_RBX;
    }
    lVar5 = lVar5 + 1;
    unaff_RBX = lVar2;
  } while (bVar1);
  if (lVar2 != lcp0) {
    __assert_fail("lcp(latest, from0) == lcp0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x41b,
                  "void check_lcp_and_cache(unsigned char *, unsigned char *, lcp_t, CharT, unsigned char *, lcp_t, CharT) [CharT = unsigned int]"
                 );
  }
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar3 = lVar6;
    if ((latest[lVar5] == '\0') || (latest[lVar5] != from1[lVar5])) {
      bVar1 = false;
      lVar6 = lVar3;
    }
    else {
      lVar6 = lVar3 + 1;
      bVar1 = true;
      lVar3 = lVar2;
    }
    lVar5 = lVar5 + 1;
    lVar2 = lVar3;
  } while (bVar1);
  if (lVar3 == lcp1) {
    if (from0 != (uchar *)0x0) {
      if (from0[lcp0] == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (uint)from0[lcp0] << 0x18;
        if (from0[lcp0 + 1] != 0) {
          uVar4 = uVar4 | (uint)from0[lcp0 + 1] << 0x10;
          if (from0[lcp0 + 2] != '\0') {
            uVar4 = uVar4 | CONCAT11(from0[lcp0 + 2],from0[lcp0 + 3]);
          }
        }
      }
      if (uVar4 != cache0) {
        __assert_fail("get_char<CharT>(from0, lcp0) == cache0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x41d,
                      "void check_lcp_and_cache(unsigned char *, unsigned char *, lcp_t, CharT, unsigned char *, lcp_t, CharT) [CharT = unsigned int]"
                     );
      }
      if (from1 != (uchar *)0x0) {
        if (from1[lcp1] == 0) {
          uVar4 = 0;
        }
        else {
          uVar4 = (uint)from1[lcp1] << 0x18;
          if (from1[lcp1 + 1] != 0) {
            uVar4 = uVar4 | (uint)from1[lcp1 + 1] << 0x10;
            if (from1[lcp1 + 2] != '\0') {
              uVar4 = uVar4 | CONCAT11(from1[lcp1 + 2],from1[lcp1 + 3]);
            }
          }
        }
        if (uVar4 == cache1) {
          return;
        }
        __assert_fail("get_char<CharT>(from1, lcp1) == cache1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x41e,
                      "void check_lcp_and_cache(unsigned char *, unsigned char *, lcp_t, CharT, unsigned char *, lcp_t, CharT) [CharT = unsigned int]"
                     );
      }
    }
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                  ,0x38,"uint32_t get_char(unsigned char *, size_t)");
  }
  __assert_fail("lcp(latest, from1) == lcp1",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                ,0x41c,
                "void check_lcp_and_cache(unsigned char *, unsigned char *, lcp_t, CharT, unsigned char *, lcp_t, CharT) [CharT = unsigned int]"
               );
}

Assistant:

static void
check_lcp_and_cache(unsigned char* latest,
                    unsigned char* from0, lcp_t lcp0, CharT cache0,
                    unsigned char* from1, lcp_t lcp1, CharT cache1)
{
	(void) latest;
	(void) from0; (void) lcp0; (void) cache0;
	(void) from1; (void) lcp1; (void) cache1;
	/*debug()<<"******** CHECK ********\n"
	       <<"Latest: '"<<latest<<"'\n"
	       <<"     0: '"<<from0<<"', lcp="<<lcp0<<", cache="<<to_str(cache0)<<"\n"
	       <<"     1: '"<<from1<<"', lcp="<<lcp1<<", cache="<<to_str(cache1)<<"\n"
	       <<"***********************\n";*/
	assert(lcp(latest, from0) == lcp0);
	assert(lcp(latest, from1) == lcp1);
	assert(get_char<CharT>(from0, lcp0) == cache0);
	assert(get_char<CharT>(from1, lcp1) == cache1);
}